

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# were.c
# Opt level: O3

int were_summon(permonst *ptr,boolean yours,int *visible,char *genbuf)

{
  boolean bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  monst *worm;
  int iVar5;
  int iVar6;
  
  iVar2 = monsndx(ptr);
  *visible = 0;
  if ((yours != '\0') || (iVar6 = 0, u.uprops[0x17].extrinsic == 0 && u.uprops[0x17].intrinsic == 0)
     ) {
    uVar3 = mt_random();
    iVar5 = uVar3 % 5 + 2;
    iVar6 = 0;
    do {
      if (iVar2 < 0x10e) {
        if (iVar2 == 0x11) {
LAB_00287381:
          uVar3 = 0xe;
          if (genbuf != (char *)0x0) {
            builtin_strncpy(genbuf,"jackal",7);
          }
        }
        else {
          if (iVar2 == 0x17) goto LAB_00287354;
          if (iVar2 != 0x5d) goto LAB_002874f2;
LAB_00287317:
          uVar4 = mt_random();
          uVar3 = 0x5a;
          if (uVar4 * -0x55555555 < 0x55555556) {
            uVar3 = mt_random();
            uVar3 = (uVar3 * -0x55555555 < 0x55555556) + 0x5b;
          }
          if (genbuf != (char *)0x0) {
            builtin_strncpy(genbuf,"rat",4);
          }
        }
LAB_00287398:
        worm = makemon(mons + uVar3,level,(int)u.ux,(int)u.uy,0);
        if (worm != (monst *)0x0) {
          if (worm->wormno == '\0') {
            if ((viz_array[worm->my][worm->mx] & 2U) != 0) goto LAB_0028748a;
            if (u.uprops[0x1e].intrinsic == 0) {
              if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0028742d;
              if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_00287424;
            }
            else {
LAB_00287424:
              if (ublindf == (obj *)0x0) goto LAB_002874de;
LAB_0028742d:
              if (ublindf->oartifact != '\x1d') goto LAB_002874de;
            }
            if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
                 (((youmonst.data)->mflags3 & 0x100) != 0)) &&
                ((viz_array[worm->my][worm->mx] & 1U) != 0)) && ((worm->data->mflags3 & 0x200) != 0)
               ) goto LAB_0028748a;
          }
          else {
            bVar1 = worm_known(level,worm);
            if (bVar1 != '\0') {
LAB_0028748a:
              uVar3 = *(uint *)&worm->field_0x60;
              if ((((uVar3 & 2) == 0) || (u.uprops[0xc].intrinsic != 0)) ||
                 (u.uprops[0xc].extrinsic != 0)) {
                if ((uVar3 & 0x280) == 0) goto LAB_002874cd;
              }
              else if (((uVar3 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0)) {
LAB_002874cd:
                if ((u._1052_1_ & 0x20) == 0) {
                  *visible = *visible + 1;
                }
              }
            }
          }
LAB_002874de:
          iVar6 = iVar6 + 1;
          if (yours != '\0') {
            tamedog(worm,(obj *)0x0);
          }
        }
      }
      else {
        if (iVar2 == 0x110) {
LAB_00287354:
          uVar3 = mt_random();
          uVar3 = (uint)(uVar3 * -0x33333333 < 0x33333334) * 4 + 0x16;
          if (genbuf != (char *)0x0) {
            builtin_strncpy(genbuf,"wolf",5);
          }
          goto LAB_00287398;
        }
        if (iVar2 == 0x10f) goto LAB_00287381;
        if (iVar2 == 0x10e) goto LAB_00287317;
      }
LAB_002874f2:
      iVar5 = iVar5 + -1;
    } while (1 < iVar5);
  }
  return iVar6;
}

Assistant:

int were_summon(const struct permonst *ptr, boolean yours,
		int *visible,	/* number of visible helpers created */
		char *genbuf)
{
	int i, typ, pm = monsndx(ptr);
	struct monst *mtmp;
	int total = 0;

	*visible = 0;
	if (Protection_from_shape_changers && !yours)
		return 0;
	for (i = rnd(5); i > 0; i--) {
	   switch(pm) {

		case PM_WERERAT:
		case PM_HUMAN_WERERAT:
			typ = rn2(3) ? PM_SEWER_RAT : rn2(3) ? PM_GIANT_RAT : PM_RABID_RAT ;
			if (genbuf) strcpy(genbuf, "rat");
			break;
		case PM_WEREJACKAL:
		case PM_HUMAN_WEREJACKAL:
			typ = PM_JACKAL;
			if (genbuf) strcpy(genbuf, "jackal");
			break;
		case PM_WEREWOLF:
		case PM_HUMAN_WEREWOLF:
			typ = rn2(5) ? PM_WOLF : PM_WINTER_WOLF ;
			if (genbuf) strcpy(genbuf, "wolf");
			break;
		default:
			continue;
	    }
	    mtmp = makemon(&mons[typ], level, u.ux, u.uy, NO_MM_FLAGS);
	    if (mtmp) {
		total++;
		if (canseemon(level, mtmp)) *visible += 1;
	    }
	    if (yours && mtmp)
		tamedog(mtmp, NULL);
	}
	return total;
}